

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::raw_hash_set(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *this,size_t bucket_count,hasher *hash,key_equal *eq,allocator_type *alloc)

{
  hasher *phVar1;
  hasher *phVar2;
  hasher *phVar3;
  size_t new_capacity;
  CommonFields local_50;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  allocator_type *alloc_local;
  key_equal *eq_local;
  hasher *hash_local;
  size_t bucket_count_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  local_30 = alloc;
  alloc_local = (allocator_type *)eq;
  eq_local = (key_equal *)hash;
  hash_local = (hasher *)bucket_count;
  bucket_count_local = (size_t)this;
  CommonFields::CreateDefault<false>();
  CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_const_absl::lts_20250127::container_internal::StringHash_&,_const_absl::lts_20250127::container_internal::StringEq_&,_const_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
            (&this->settings_,&local_50,(StringHash *)eq_local,(StringEq *)alloc_local,local_30);
  phVar3 = hash_local;
  phVar2 = (hasher *)DefaultCapacity();
  phVar1 = hash_local;
  if (phVar2 < phVar3) {
    phVar3 = (hasher *)MaxValidCapacity<48ul>();
    if (phVar3 < phVar1) {
      HashTableSizeOverflow();
    }
    new_capacity = NormalizeCapacity((size_t)hash_local);
    resize(this,new_capacity);
  }
  return;
}

Assistant:

raw_hash_set(
      size_t bucket_count, const hasher& hash = hasher(),
      const key_equal& eq = key_equal(),
      const allocator_type& alloc = allocator_type())
      : settings_(CommonFields::CreateDefault<SooEnabled()>(), hash, eq,
                  alloc) {
    if (bucket_count > DefaultCapacity()) {
      if (ABSL_PREDICT_FALSE(bucket_count >
                             MaxValidCapacity<sizeof(slot_type)>())) {
        HashTableSizeOverflow();
      }
      resize(NormalizeCapacity(bucket_count));
    }
  }